

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_APPLE_sync(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_APPLE_sync != 0) {
    glad_glFenceSyncAPPLE = (PFNGLFENCESYNCAPPLEPROC)(*load)("glFenceSyncAPPLE");
    glad_glIsSyncAPPLE = (PFNGLISSYNCAPPLEPROC)(*load)("glIsSyncAPPLE");
    glad_glDeleteSyncAPPLE = (PFNGLDELETESYNCAPPLEPROC)(*load)("glDeleteSyncAPPLE");
    glad_glClientWaitSyncAPPLE = (PFNGLCLIENTWAITSYNCAPPLEPROC)(*load)("glClientWaitSyncAPPLE");
    glad_glWaitSyncAPPLE = (PFNGLWAITSYNCAPPLEPROC)(*load)("glWaitSyncAPPLE");
    glad_glGetInteger64vAPPLE = (PFNGLGETINTEGER64VAPPLEPROC)(*load)("glGetInteger64vAPPLE");
    glad_glGetSyncivAPPLE = (PFNGLGETSYNCIVAPPLEPROC)(*load)("glGetSyncivAPPLE");
  }
  return;
}

Assistant:

static void load_GL_APPLE_sync(GLADloadproc load) {
	if(!GLAD_GL_APPLE_sync) return;
	glad_glFenceSyncAPPLE = (PFNGLFENCESYNCAPPLEPROC)load("glFenceSyncAPPLE");
	glad_glIsSyncAPPLE = (PFNGLISSYNCAPPLEPROC)load("glIsSyncAPPLE");
	glad_glDeleteSyncAPPLE = (PFNGLDELETESYNCAPPLEPROC)load("glDeleteSyncAPPLE");
	glad_glClientWaitSyncAPPLE = (PFNGLCLIENTWAITSYNCAPPLEPROC)load("glClientWaitSyncAPPLE");
	glad_glWaitSyncAPPLE = (PFNGLWAITSYNCAPPLEPROC)load("glWaitSyncAPPLE");
	glad_glGetInteger64vAPPLE = (PFNGLGETINTEGER64VAPPLEPROC)load("glGetInteger64vAPPLE");
	glad_glGetSyncivAPPLE = (PFNGLGETSYNCIVAPPLEPROC)load("glGetSyncivAPPLE");
}